

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O1

short filter_run_buf(filter *f,short *in,float *out,int step,int len)

{
  float *__dest;
  short sVar1;
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  uint uVar5;
  short sVar6;
  ulong uVar8;
  long lVar9;
  float fVar10;
  int iVar7;
  
  uVar5 = f->pointer;
  if (len < 1) {
    sVar6 = 0;
  }
  else {
    __dest = f->buffer;
    uVar2 = f->length;
    pfVar3 = f->taps;
    uVar8 = 0;
    lVar9 = 0;
    iVar7 = 0;
    do {
      sVar1 = in[lVar9];
      if ((short)iVar7 < sVar1) {
        iVar7 = (int)sVar1;
      }
      sVar6 = (short)iVar7;
      __dest[(int)uVar5] = (float)(int)sVar1;
      if ((int)uVar2 < 1) {
        fVar10 = 0.0;
      }
      else {
        fVar10 = 0.0;
        uVar4 = 0;
        do {
          fVar10 = fVar10 + __dest[(long)(int)(uVar5 - uVar2) + uVar4] * pfVar3[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      out[uVar8] = fVar10;
      uVar5 = uVar5 + 1;
      if (uVar5 == 0x400) {
        memcpy(__dest,&f->pointer + -(long)(int)uVar2,(long)(int)uVar2 * 4);
        uVar5 = uVar2;
      }
      lVar9 = lVar9 + step;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)len);
  }
  f->pointer = uVar5;
  return sVar6;
}

Assistant:

short filter_run_buf(struct filter *f, short *in, float *out, int step, int len)
{
	int id = 0;
	int od = 0;
	short maxval = 0;
	int pointer = f->pointer;
	float *buffer = f->buffer;
	
	while (od < len) {
	        buffer[pointer] = in[id];
		
		// look for peak volume
		if (in[id] > maxval)
			maxval = in[id];
		
		#ifndef __HAVE_ARCH_MAC	
		out[od] = filter_mac(&buffer[pointer - f->length], f->taps, f->length);
		#else
		out[od] = mac(&buffer[pointer - f->length], f->taps, f->length);
		#endif
		pointer++;
		
		/* the buffer is much smaller than the incoming chunks */
		if (pointer == BufferLen) {
			memcpy(buffer, 
			       buffer + BufferLen - f->length,
			       f->length * sizeof(float));
			pointer = f->length;
		}
		
		id += step;
		od++;
	}
	
	f->pointer = pointer;
	
	return maxval;
}